

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

Map * new_map(uint size)

{
  ulong uVar1;
  Map *pMVar2;
  void **ppvVar3;
  uint uVar4;
  ulong in_RSI;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  pMVar2 = (Map *)malloc(0x18);
  uVar7 = 0xb;
  if (size != 0) {
    uVar7 = (ulong)size;
  }
  pMVar2->size = 0;
  pMVar2->capacity = (uint)uVar7;
  ppvVar3 = (void **)malloc(uVar7 * 0x18);
  pMVar2->elem = ppvVar3;
  uVar4 = 2;
  if (1 < (uint)uVar7) {
    do {
      bVar8 = true;
      uVar6 = (uint)uVar7;
      if ((2 < uVar6) && (bVar8 = (uVar7 & 1) == 0, !bVar8)) {
        uVar5 = 3;
        do {
          if (uVar6 == uVar5) {
            bVar8 = false;
            in_RSI = uVar7;
            break;
          }
          uVar1 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          bVar8 = (int)(uVar7 % uVar1) == 0;
        } while (!bVar8);
      }
      if (!bVar8) {
        uVar4 = (uint)in_RSI;
        break;
      }
      uVar7 = (ulong)(uVar6 - 1);
    } while (2 < uVar6);
  }
  pMVar2->prime = uVar4;
  return pMVar2;
}

Assistant:

Map *new_map(unsigned int size) {
    Map *map = malloc(sizeof(Map));
    map->size = 0;
    map->capacity = size ? size : 11;
    map->elem = malloc(sizeof(List) * map->capacity);
    map->prime = get_max_prime(map->capacity);
    return map;
}